

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void test<unsigned_char>(bool shouldBeValid,string *value)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  AssertHelper local_e0;
  Message local_d8;
  string local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  uchar result2;
  Message local_90;
  string local_88;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_50 [3];
  Message local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  uchar result;
  bool valid;
  string *value_local;
  bool shouldBeValid_local;
  
  value_local._7_1_ = shouldBeValid;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  lVar3 = std::__cxx11::string::c_str();
  lVar4 = std::__cxx11::string::size();
  gtest_ar.message_.ptr_._6_1_ =
       jsteemann::atoi<unsigned_char>
                 (pcVar2,(char *)(lVar3 + lVar4),(bool *)((long)&gtest_ar.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_30,"shouldBeValid","valid",(bool *)((long)&value_local + 7),
             (bool *)((long)&gtest_ar.message_.ptr_ + 7));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0xc,pcVar2);
    testing::internal::AssertHelper::operator=(local_50,&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::Message::~Message(&local_38);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if ((gtest_ar_1.message_.ptr_._4_4_ == 0) && ((value_local._7_1_ & 1) != 0)) {
    std::__cxx11::to_string(&local_88,(uint)gtest_ar.message_.ptr_._6_1_);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_68,"value","std::to_string(result)",value,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff68,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                 ,0xe,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff68,&local_90)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff68);
      testing::Message::~Message(&local_90);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      lVar3 = std::__cxx11::string::c_str();
      lVar4 = std::__cxx11::string::size();
      gtest_ar_2.message_.ptr_._7_1_ =
           jsteemann::atoi_unchecked<unsigned_char>(pcVar2,(char *)(lVar3 + lVar4));
      std::__cxx11::to_string(&local_d0,(uint)gtest_ar_2.message_.ptr_._7_1_);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                ((EqHelper<false> *)local_b0,"value","std::to_string(result2)",value,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                   ,0x10,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    }
  }
  return;
}

Assistant:

static void test(bool shouldBeValid, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_EQ(shouldBeValid, valid);
  if (shouldBeValid) {
    ASSERT_EQ(value, std::to_string(result));
    T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
    ASSERT_EQ(value, std::to_string(result2));
  }
}